

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bench_impl.h
# Opt level: O1

void bench_ellswift_xdh(void *arg,int iters)

{
  char cVar1;
  char cVar2;
  short sVar9;
  short sVar10;
  short sVar11;
  short sVar12;
  short sVar13;
  short sVar14;
  short sVar15;
  short sVar16;
  short sVar17;
  short sVar18;
  short sVar19;
  short sVar20;
  bool bVar21;
  int iVar22;
  int iVar23;
  int iVar24;
  char *pcVar25;
  undefined1 *puVar26;
  void *pvVar27;
  void *pvVar28;
  void *pvVar29;
  long lVar30;
  long lVar31;
  char **argv;
  int argc;
  ulong uVar33;
  char **ppcVar34;
  ulong uVar35;
  size_t __size;
  long lVar36;
  char cVar37;
  char cVar39;
  char cVar40;
  char cVar41;
  char cVar42;
  char cVar43;
  char cVar44;
  char cVar45;
  char cVar46;
  char cVar47;
  char cVar48;
  char cVar49;
  char cVar50;
  char cVar51;
  char cVar52;
  undefined1 auVar38 [16];
  char cVar53;
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  short sVar61;
  short sVar62;
  undefined1 auVar69 [16];
  short sVar70;
  short sVar71;
  undefined1 auVar76 [12];
  undefined1 auVar81 [16];
  undefined4 uVar83;
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  int in_stack_fffffffffffffd50;
  undefined8 auStack_288 [2];
  void *pvStack_278;
  void *pvStack_270;
  void *pvStack_268;
  void *pvStack_260;
  long lStack_258;
  undefined1 uStack_250;
  undefined1 uStack_24f;
  undefined1 uStack_24e;
  undefined1 uStack_24d;
  undefined8 uStack_24c;
  undefined4 uStack_244;
  undefined4 uStack_240;
  undefined4 uStack_23c;
  undefined8 uStack_238;
  undefined8 uStack_228;
  char acStack_220 [32];
  undefined1 auStack_200 [32];
  undefined1 auStack_1e0 [72];
  undefined8 uStack_198;
  undefined1 auStack_190 [40];
  undefined8 uStack_168;
  undefined8 auStack_160 [13];
  undefined1 auStack_f8 [64];
  undefined1 auStack_b8 [64];
  undefined8 uStack_78;
  ulong uStack_70;
  ulong uStack_68;
  long lStack_60;
  long lStack_58;
  code *pcStack_50;
  int local_44;
  undefined8 *local_40;
  undefined8 local_38;
  char cVar3;
  char cVar4;
  char cVar5;
  char cVar6;
  char cVar7;
  char cVar8;
  undefined8 uVar32;
  undefined4 uVar63;
  undefined6 uVar64;
  undefined1 auVar65 [12];
  undefined1 auVar66 [12];
  undefined1 auVar67 [14];
  undefined1 auVar68 [14];
  undefined4 uVar72;
  undefined6 uVar73;
  undefined8 uVar74;
  undefined1 auVar75 [12];
  undefined1 auVar77 [12];
  undefined1 auVar78 [14];
  undefined1 auVar79 [14];
  undefined1 auVar80 [14];
  undefined1 auVar82 [16];
  undefined6 uVar84;
  undefined8 uVar85;
  undefined1 auVar86 [12];
  undefined1 auVar87 [14];
  undefined1 auVar90 [16];
  
  if (iters < 1) {
    return;
  }
  lVar31 = (long)arg + 0x4008;
  local_38 = _secp256k1_ellswift_xdh_hash_function_bip324;
  lVar30 = (long)arg + 0x4018;
  uVar33 = 0x10;
  uVar35 = 0;
  lVar36 = lVar31;
  local_44 = iters;
  local_40 = (undefined8 *)arg;
  while( true ) {
    argv = (char **)(lVar36 + (uVar35 / 0x21) * -0x21);
    uVar32 = *local_40;
    pcStack_50 = (code *)0x0;
    lStack_58 = local_38;
    lStack_60 = 0x102fe0;
    iVar22 = secp256k1_ellswift_xdh(uVar32,argv,lVar31,lVar31,lVar30 + (uVar33 / 0x21) * -0x21);
    argc = (int)uVar32;
    if (iVar22 != 1) break;
    uVar35 = uVar35 + 1;
    lVar30 = lVar30 + 1;
    uVar33 = uVar33 + 1;
    lVar36 = lVar36 + 1;
    if (local_44 == (int)uVar35) {
      return;
    }
  }
  pcStack_50 = main;
  bench_ellswift_xdh_cold_1();
  uStack_78 = 0xf83e0f83e0f83e1;
  uStack_70 = uVar33;
  uStack_68 = uVar35;
  lStack_60 = lVar31;
  lStack_58 = lVar36;
  pcStack_50 = (code *)lVar30;
  pcVar25 = getenv("SECP256K1_BENCH_ITERS");
  if (pcVar25 == (char *)0x0) {
    uVar33 = 20000;
  }
  else {
    uVar33 = strtol(pcVar25,(char **)0x0,0);
  }
  bVar21 = true;
  if (argc != 1) {
    ppcVar34 = argv + 1;
    do {
      pcVar25 = *ppcVar34;
      lVar31 = 0;
      while (iVar22 = strcmp(pcVar25,*(char **)((long)&PTR_anon_var_dwarf_d5_00108d20 + lVar31)),
            iVar22 != 0) {
        lVar31 = lVar31 + 8;
        if (lVar31 == 0xa8) {
          bVar21 = false;
          goto LAB_001030c7;
        }
      }
      ppcVar34 = ppcVar34 + 1;
    } while (ppcVar34 != argv + argc);
    bVar21 = true;
  }
LAB_001030c7:
  lVar31 = (long)argc * 8;
  if (1 < argc) {
    lVar30 = 8;
    do {
      lVar36 = lVar30;
      if (lVar31 - lVar36 == 0) goto LAB_0010310a;
      pcVar25 = *(char **)((long)argv + lVar36);
      iVar22 = strcmp(pcVar25,"-h");
      iVar23 = (int)pcVar25;
      lVar30 = lVar36 + 8;
    } while (iVar22 != 0);
    if (lVar31 - lVar36 != 0) {
LAB_00103164:
      help(iVar23);
      return;
    }
LAB_0010310a:
    lVar30 = 8;
    do {
      lVar36 = lVar30;
      if (lVar31 - lVar36 == 0) goto LAB_00103137;
      pcVar25 = *(char **)((long)argv + lVar36);
      iVar22 = strcmp(pcVar25,"--help");
      iVar23 = (int)pcVar25;
      lVar30 = lVar36 + 8;
    } while (iVar22 != 0);
    if (lVar31 - lVar36 != 0) goto LAB_00103164;
LAB_00103137:
    lVar30 = 8;
    do {
      lVar36 = lVar30;
      if (lVar31 - lVar36 == 0) goto LAB_0010316e;
      pcVar25 = *(char **)((long)argv + lVar36);
      iVar22 = strcmp(pcVar25,"help");
      iVar23 = (int)pcVar25;
      lVar30 = lVar36 + 8;
    } while (iVar22 != 0);
    if (lVar31 - lVar36 != 0) goto LAB_00103164;
LAB_0010316e:
    if (!bVar21) {
      main_cold_1();
      return;
    }
  }
  lVar30 = 8;
  do {
    lVar36 = lVar30;
    if (lVar31 - lVar36 == 0) goto LAB_001031aa;
    iVar22 = strcmp(*(char **)((long)argv + lVar36),"recover");
    lVar30 = lVar36 + 8;
  } while (iVar22 != 0);
  if (lVar31 - lVar36 != 0) {
LAB_00103a45:
    main_cold_2();
    return;
  }
LAB_001031aa:
  lVar30 = 8;
  do {
    lVar36 = lVar30;
    if (lVar31 - lVar36 == 0) goto LAB_001031db;
    iVar22 = strcmp(*(char **)((long)argv + lVar36),"ecdsa_recover");
    lVar30 = lVar36 + 8;
  } while (iVar22 != 0);
  if (lVar31 - lVar36 != 0) goto LAB_00103a45;
LAB_001031db:
  uStack_228 = secp256k1_context_create(1);
  lVar30 = 8;
  auVar38 = _DAT_00105010;
  auVar54 = _DAT_00105020;
  auVar55 = _DAT_00105030;
  auVar56 = _DAT_00105040;
  auVar57 = _DAT_00105050;
  auVar58 = _DAT_00105060;
  auVar59 = _DAT_00105070;
  auVar60 = _DAT_00105080;
  do {
    auVar69 = auVar60 & _DAT_00105090;
    auVar81 = auVar59 & _DAT_00105090;
    sVar9 = auVar69._0_2_;
    cVar45 = (0 < sVar9) * (sVar9 < 0x100) * auVar69[0] - (0xff < sVar9);
    sVar9 = auVar69._2_2_;
    sVar61 = CONCAT11((0 < sVar9) * (sVar9 < 0x100) * auVar69[2] - (0xff < sVar9),cVar45);
    sVar9 = auVar69._4_2_;
    cVar37 = (0 < sVar9) * (sVar9 < 0x100) * auVar69[4] - (0xff < sVar9);
    sVar9 = auVar69._6_2_;
    uVar63 = CONCAT13((0 < sVar9) * (sVar9 < 0x100) * auVar69[6] - (0xff < sVar9),
                      CONCAT12(cVar37,sVar61));
    sVar9 = auVar69._8_2_;
    cVar39 = (0 < sVar9) * (sVar9 < 0x100) * auVar69[8] - (0xff < sVar9);
    sVar9 = auVar69._10_2_;
    uVar64 = CONCAT15((0 < sVar9) * (sVar9 < 0x100) * auVar69[10] - (0xff < sVar9),
                      CONCAT14(cVar39,uVar63));
    sVar9 = auVar69._12_2_;
    cVar40 = (0 < sVar9) * (sVar9 < 0x100) * auVar69[0xc] - (0xff < sVar9);
    sVar9 = auVar69._14_2_;
    uVar32 = CONCAT17((0 < sVar9) * (sVar9 < 0x100) * auVar69[0xe] - (0xff < sVar9),
                      CONCAT16(cVar40,uVar64));
    sVar9 = auVar81._0_2_;
    cVar41 = (0 < sVar9) * (sVar9 < 0x100) * auVar81[0] - (0xff < sVar9);
    sVar9 = auVar81._2_2_;
    auVar65._0_10_ =
         CONCAT19((0 < sVar9) * (sVar9 < 0x100) * auVar81[2] - (0xff < sVar9),
                  CONCAT18(cVar41,uVar32));
    sVar9 = auVar81._4_2_;
    cVar42 = (0 < sVar9) * (sVar9 < 0x100) * auVar81[4] - (0xff < sVar9);
    auVar65[10] = cVar42;
    sVar9 = auVar81._6_2_;
    auVar65[0xb] = (0 < sVar9) * (sVar9 < 0x100) * auVar81[6] - (0xff < sVar9);
    sVar9 = auVar81._8_2_;
    cVar43 = (0 < sVar9) * (sVar9 < 0x100) * auVar81[8] - (0xff < sVar9);
    auVar67[0xc] = cVar43;
    auVar67._0_12_ = auVar65;
    sVar9 = auVar81._10_2_;
    auVar67[0xd] = (0 < sVar9) * (sVar9 < 0x100) * auVar81[10] - (0xff < sVar9);
    sVar9 = auVar81._12_2_;
    cVar44 = (0 < sVar9) * (sVar9 < 0x100) * auVar81[0xc] - (0xff < sVar9);
    auVar69[0xe] = cVar44;
    auVar69._0_14_ = auVar67;
    sVar9 = auVar81._14_2_;
    auVar69[0xf] = (0 < sVar9) * (sVar9 < 0x100) * auVar81[0xe] - (0xff < sVar9);
    auVar81 = auVar58 & _DAT_00105090;
    auVar88 = auVar57 & _DAT_00105090;
    sVar9 = auVar81._0_2_;
    cVar53 = (0 < sVar9) * (sVar9 < 0x100) * auVar81[0] - (0xff < sVar9);
    sVar9 = auVar81._2_2_;
    sVar70 = CONCAT11((0 < sVar9) * (sVar9 < 0x100) * auVar81[2] - (0xff < sVar9),cVar53);
    sVar9 = auVar81._4_2_;
    cVar52 = (0 < sVar9) * (sVar9 < 0x100) * auVar81[4] - (0xff < sVar9);
    sVar9 = auVar81._6_2_;
    uVar72 = CONCAT13((0 < sVar9) * (sVar9 < 0x100) * auVar81[6] - (0xff < sVar9),
                      CONCAT12(cVar52,sVar70));
    sVar9 = auVar81._8_2_;
    cVar46 = (0 < sVar9) * (sVar9 < 0x100) * auVar81[8] - (0xff < sVar9);
    sVar9 = auVar81._10_2_;
    uVar73 = CONCAT15((0 < sVar9) * (sVar9 < 0x100) * auVar81[10] - (0xff < sVar9),
                      CONCAT14(cVar46,uVar72));
    sVar9 = auVar81._12_2_;
    cVar51 = (0 < sVar9) * (sVar9 < 0x100) * auVar81[0xc] - (0xff < sVar9);
    sVar9 = auVar81._14_2_;
    uVar74 = CONCAT17((0 < sVar9) * (sVar9 < 0x100) * auVar81[0xe] - (0xff < sVar9),
                      CONCAT16(cVar51,uVar73));
    sVar9 = auVar88._0_2_;
    cVar50 = (0 < sVar9) * (sVar9 < 0x100) * auVar88[0] - (0xff < sVar9);
    sVar9 = auVar88._2_2_;
    auVar75._0_10_ =
         CONCAT19((0 < sVar9) * (sVar9 < 0x100) * auVar88[2] - (0xff < sVar9),
                  CONCAT18(cVar50,uVar74));
    sVar9 = auVar88._4_2_;
    cVar49 = (0 < sVar9) * (sVar9 < 0x100) * auVar88[4] - (0xff < sVar9);
    auVar75[10] = cVar49;
    sVar9 = auVar88._6_2_;
    auVar75[0xb] = (0 < sVar9) * (sVar9 < 0x100) * auVar88[6] - (0xff < sVar9);
    sVar9 = auVar88._8_2_;
    cVar48 = (0 < sVar9) * (sVar9 < 0x100) * auVar88[8] - (0xff < sVar9);
    auVar78[0xc] = cVar48;
    auVar78._0_12_ = auVar75;
    sVar9 = auVar88._10_2_;
    auVar78[0xd] = (0 < sVar9) * (sVar9 < 0x100) * auVar88[10] - (0xff < sVar9);
    sVar9 = auVar88._12_2_;
    cVar47 = (0 < sVar9) * (sVar9 < 0x100) * auVar88[0xc] - (0xff < sVar9);
    auVar89[0xe] = cVar47;
    auVar89._0_14_ = auVar78;
    sVar9 = auVar88._14_2_;
    auVar89[0xf] = (0 < sVar9) * (sVar9 < 0x100) * auVar88[0xe] - (0xff < sVar9);
    cVar1 = (0 < sVar61) * (sVar61 < 0x100) * cVar45 - (0xff < sVar61);
    sVar9 = (short)((uint)uVar63 >> 0x10);
    sVar62 = CONCAT11((0 < sVar9) * (sVar9 < 0x100) * cVar37 - (0xff < sVar9),cVar1);
    sVar9 = (short)((uint6)uVar64 >> 0x20);
    cVar45 = (0 < sVar9) * (sVar9 < 0x100) * cVar39 - (0xff < sVar9);
    sVar9 = (short)((ulong)uVar32 >> 0x30);
    uVar63 = CONCAT13((0 < sVar9) * (sVar9 < 0x100) * cVar40 - (0xff < sVar9),
                      CONCAT12(cVar45,sVar62));
    sVar9 = (short)((unkuint10)auVar65._0_10_ >> 0x40);
    cVar37 = (0 < sVar9) * (sVar9 < 0x100) * cVar41 - (0xff < sVar9);
    sVar9 = auVar65._10_2_;
    uVar64 = CONCAT15((0 < sVar9) * (sVar9 < 0x100) * cVar42 - (0xff < sVar9),
                      CONCAT14(cVar37,uVar63));
    sVar9 = auVar67._12_2_;
    cVar43 = (0 < sVar9) * (sVar9 < 0x100) * cVar43 - (0xff < sVar9);
    sVar9 = auVar69._14_2_;
    uVar32 = CONCAT17((0 < sVar9) * (sVar9 < 0x100) * cVar44 - (0xff < sVar9),
                      CONCAT16(cVar43,uVar64));
    cVar42 = (0 < sVar70) * (sVar70 < 0x100) * cVar53 - (0xff < sVar70);
    sVar9 = (short)((uint)uVar72 >> 0x10);
    auVar66._0_10_ =
         CONCAT19((0 < sVar9) * (sVar9 < 0x100) * cVar52 - (0xff < sVar9),CONCAT18(cVar42,uVar32));
    sVar9 = (short)((uint6)uVar73 >> 0x20);
    cVar41 = (0 < sVar9) * (sVar9 < 0x100) * cVar46 - (0xff < sVar9);
    auVar66[10] = cVar41;
    sVar9 = (short)((ulong)uVar74 >> 0x30);
    auVar66[0xb] = (0 < sVar9) * (sVar9 < 0x100) * cVar51 - (0xff < sVar9);
    sVar9 = (short)((unkuint10)auVar75._0_10_ >> 0x40);
    cVar40 = (0 < sVar9) * (sVar9 < 0x100) * cVar50 - (0xff < sVar9);
    auVar68[0xc] = cVar40;
    auVar68._0_12_ = auVar66;
    sVar9 = auVar75._10_2_;
    auVar68[0xd] = (0 < sVar9) * (sVar9 < 0x100) * cVar49 - (0xff < sVar9);
    sVar9 = auVar78._12_2_;
    cVar39 = (0 < sVar9) * (sVar9 < 0x100) * cVar48 - (0xff < sVar9);
    auVar81[0xe] = cVar39;
    auVar81._0_14_ = auVar68;
    sVar9 = auVar89._14_2_;
    auVar81[0xf] = (0 < sVar9) * (sVar9 < 0x100) * cVar47 - (0xff < sVar9);
    auVar69 = auVar56 & _DAT_00105090;
    auVar89 = auVar55 & _DAT_00105090;
    sVar9 = auVar69._0_2_;
    cVar44 = (0 < sVar9) * (sVar9 < 0x100) * auVar69[0] - (0xff < sVar9);
    sVar9 = auVar69._2_2_;
    sVar61 = CONCAT11((0 < sVar9) * (sVar9 < 0x100) * auVar69[2] - (0xff < sVar9),cVar44);
    sVar9 = auVar69._4_2_;
    cVar46 = (0 < sVar9) * (sVar9 < 0x100) * auVar69[4] - (0xff < sVar9);
    sVar9 = auVar69._6_2_;
    uVar72 = CONCAT13((0 < sVar9) * (sVar9 < 0x100) * auVar69[6] - (0xff < sVar9),
                      CONCAT12(cVar46,sVar61));
    sVar9 = auVar69._8_2_;
    cVar47 = (0 < sVar9) * (sVar9 < 0x100) * auVar69[8] - (0xff < sVar9);
    sVar9 = auVar69._10_2_;
    uVar73 = CONCAT15((0 < sVar9) * (sVar9 < 0x100) * auVar69[10] - (0xff < sVar9),
                      CONCAT14(cVar47,uVar72));
    sVar9 = auVar69._12_2_;
    cVar48 = (0 < sVar9) * (sVar9 < 0x100) * auVar69[0xc] - (0xff < sVar9);
    sVar9 = auVar69._14_2_;
    uVar74 = CONCAT17((0 < sVar9) * (sVar9 < 0x100) * auVar69[0xe] - (0xff < sVar9),
                      CONCAT16(cVar48,uVar73));
    sVar9 = auVar89._0_2_;
    cVar49 = (0 < sVar9) * (sVar9 < 0x100) * auVar89[0] - (0xff < sVar9);
    sVar9 = auVar89._2_2_;
    auVar76._0_10_ =
         CONCAT19((0 < sVar9) * (sVar9 < 0x100) * auVar89[2] - (0xff < sVar9),
                  CONCAT18(cVar49,uVar74));
    sVar9 = auVar89._4_2_;
    cVar50 = (0 < sVar9) * (sVar9 < 0x100) * auVar89[4] - (0xff < sVar9);
    auVar76[10] = cVar50;
    sVar9 = auVar89._6_2_;
    auVar76[0xb] = (0 < sVar9) * (sVar9 < 0x100) * auVar89[6] - (0xff < sVar9);
    sVar9 = auVar89._8_2_;
    cVar51 = (0 < sVar9) * (sVar9 < 0x100) * auVar89[8] - (0xff < sVar9);
    auVar79[0xc] = cVar51;
    auVar79._0_12_ = auVar76;
    sVar9 = auVar89._10_2_;
    auVar79[0xd] = (0 < sVar9) * (sVar9 < 0x100) * auVar89[10] - (0xff < sVar9);
    sVar9 = auVar89._12_2_;
    cVar52 = (0 < sVar9) * (sVar9 < 0x100) * auVar89[0xc] - (0xff < sVar9);
    auVar88[0xe] = cVar52;
    auVar88._0_14_ = auVar79;
    sVar9 = auVar89._14_2_;
    auVar88[0xf] = (0 < sVar9) * (sVar9 < 0x100) * auVar89[0xe] - (0xff < sVar9);
    auVar69 = auVar54 & _DAT_00105090;
    auVar89 = auVar38 & _DAT_00105090;
    sVar9 = auVar69._0_2_;
    cVar53 = (0 < sVar9) * (sVar9 < 0x100) * auVar69[0] - (0xff < sVar9);
    sVar9 = auVar69._2_2_;
    sVar70 = CONCAT11((0 < sVar9) * (sVar9 < 0x100) * auVar69[2] - (0xff < sVar9),cVar53);
    sVar9 = auVar69._4_2_;
    cVar2 = (0 < sVar9) * (sVar9 < 0x100) * auVar69[4] - (0xff < sVar9);
    sVar9 = auVar69._6_2_;
    uVar83 = CONCAT13((0 < sVar9) * (sVar9 < 0x100) * auVar69[6] - (0xff < sVar9),
                      CONCAT12(cVar2,sVar70));
    sVar9 = auVar69._8_2_;
    cVar3 = (0 < sVar9) * (sVar9 < 0x100) * auVar69[8] - (0xff < sVar9);
    sVar9 = auVar69._10_2_;
    uVar84 = CONCAT15((0 < sVar9) * (sVar9 < 0x100) * auVar69[10] - (0xff < sVar9),
                      CONCAT14(cVar3,uVar83));
    sVar9 = auVar69._12_2_;
    cVar4 = (0 < sVar9) * (sVar9 < 0x100) * auVar69[0xc] - (0xff < sVar9);
    sVar9 = auVar69._14_2_;
    uVar85 = CONCAT17((0 < sVar9) * (sVar9 < 0x100) * auVar69[0xe] - (0xff < sVar9),
                      CONCAT16(cVar4,uVar84));
    sVar9 = auVar89._0_2_;
    cVar5 = (0 < sVar9) * (sVar9 < 0x100) * auVar89[0] - (0xff < sVar9);
    sVar9 = auVar89._2_2_;
    auVar86._0_10_ =
         CONCAT19((0 < sVar9) * (sVar9 < 0x100) * auVar89[2] - (0xff < sVar9),CONCAT18(cVar5,uVar85)
                 );
    sVar9 = auVar89._4_2_;
    cVar6 = (0 < sVar9) * (sVar9 < 0x100) * auVar89[4] - (0xff < sVar9);
    auVar86[10] = cVar6;
    sVar9 = auVar89._6_2_;
    auVar86[0xb] = (0 < sVar9) * (sVar9 < 0x100) * auVar89[6] - (0xff < sVar9);
    sVar9 = auVar89._8_2_;
    cVar7 = (0 < sVar9) * (sVar9 < 0x100) * auVar89[8] - (0xff < sVar9);
    auVar87[0xc] = cVar7;
    auVar87._0_12_ = auVar86;
    sVar9 = auVar89._10_2_;
    auVar87[0xd] = (0 < sVar9) * (sVar9 < 0x100) * auVar89[10] - (0xff < sVar9);
    sVar9 = auVar89._12_2_;
    cVar8 = (0 < sVar9) * (sVar9 < 0x100) * auVar89[0xc] - (0xff < sVar9);
    auVar90[0xe] = cVar8;
    auVar90._0_14_ = auVar87;
    sVar9 = auVar89._14_2_;
    auVar90[0xf] = (0 < sVar9) * (sVar9 < 0x100) * auVar89[0xe] - (0xff < sVar9);
    cVar44 = (0 < sVar61) * (sVar61 < 0x100) * cVar44 - (0xff < sVar61);
    sVar9 = (short)((uint)uVar72 >> 0x10);
    sVar71 = CONCAT11((0 < sVar9) * (sVar9 < 0x100) * cVar46 - (0xff < sVar9),cVar44);
    sVar9 = (short)((uint6)uVar73 >> 0x20);
    cVar46 = (0 < sVar9) * (sVar9 < 0x100) * cVar47 - (0xff < sVar9);
    sVar9 = (short)((ulong)uVar74 >> 0x30);
    uVar72 = CONCAT13((0 < sVar9) * (sVar9 < 0x100) * cVar48 - (0xff < sVar9),
                      CONCAT12(cVar46,sVar71));
    sVar9 = (short)((unkuint10)auVar76._0_10_ >> 0x40);
    cVar47 = (0 < sVar9) * (sVar9 < 0x100) * cVar49 - (0xff < sVar9);
    sVar9 = auVar76._10_2_;
    uVar73 = CONCAT15((0 < sVar9) * (sVar9 < 0x100) * cVar50 - (0xff < sVar9),
                      CONCAT14(cVar47,uVar72));
    sVar9 = auVar79._12_2_;
    cVar48 = (0 < sVar9) * (sVar9 < 0x100) * cVar51 - (0xff < sVar9);
    sVar9 = auVar88._14_2_;
    uVar74 = CONCAT17((0 < sVar9) * (sVar9 < 0x100) * cVar52 - (0xff < sVar9),
                      CONCAT16(cVar48,uVar73));
    cVar49 = (0 < sVar70) * (sVar70 < 0x100) * cVar53 - (0xff < sVar70);
    sVar9 = (short)((uint)uVar83 >> 0x10);
    auVar77._0_10_ =
         CONCAT19((0 < sVar9) * (sVar9 < 0x100) * cVar2 - (0xff < sVar9),CONCAT18(cVar49,uVar74));
    sVar9 = (short)((uint6)uVar84 >> 0x20);
    cVar50 = (0 < sVar9) * (sVar9 < 0x100) * cVar3 - (0xff < sVar9);
    auVar77[10] = cVar50;
    sVar9 = (short)((ulong)uVar85 >> 0x30);
    auVar77[0xb] = (0 < sVar9) * (sVar9 < 0x100) * cVar4 - (0xff < sVar9);
    sVar9 = (short)((unkuint10)auVar86._0_10_ >> 0x40);
    cVar51 = (0 < sVar9) * (sVar9 < 0x100) * cVar5 - (0xff < sVar9);
    auVar80[0xc] = cVar51;
    auVar80._0_12_ = auVar77;
    sVar9 = auVar86._10_2_;
    auVar80[0xd] = (0 < sVar9) * (sVar9 < 0x100) * cVar6 - (0xff < sVar9);
    sVar9 = auVar87._12_2_;
    cVar52 = (0 < sVar9) * (sVar9 < 0x100) * cVar7 - (0xff < sVar9);
    auVar82[0xe] = cVar52;
    auVar82._0_14_ = auVar80;
    sVar9 = auVar90._14_2_;
    auVar82[0xf] = (0 < sVar9) * (sVar9 < 0x100) * cVar8 - (0xff < sVar9);
    sVar9 = (short)((uint)uVar63 >> 0x10);
    sVar61 = (short)((uint6)uVar64 >> 0x20);
    sVar70 = (short)((ulong)uVar32 >> 0x30);
    sVar10 = (short)((unkuint10)auVar66._0_10_ >> 0x40);
    sVar11 = auVar66._10_2_;
    sVar12 = auVar68._12_2_;
    sVar13 = auVar81._14_2_;
    sVar14 = (short)((uint)uVar72 >> 0x10);
    sVar15 = (short)((uint6)uVar73 >> 0x20);
    sVar16 = (short)((ulong)uVar74 >> 0x30);
    sVar17 = (short)((unkuint10)auVar77._0_10_ >> 0x40);
    sVar18 = auVar77._10_2_;
    sVar19 = auVar80._12_2_;
    sVar20 = auVar82._14_2_;
    acStack_220[lVar30 + -8] = ((0 < sVar62) * (sVar62 < 0x100) * cVar1 - (0xff < sVar62)) + '\x01';
    acStack_220[lVar30 + -7] = ((0 < sVar9) * (sVar9 < 0x100) * cVar45 - (0xff < sVar9)) + '\x01';
    acStack_220[lVar30 + -6] = ((0 < sVar61) * (sVar61 < 0x100) * cVar37 - (0xff < sVar61)) + '\x01'
    ;
    acStack_220[lVar30 + -5] = ((0 < sVar70) * (sVar70 < 0x100) * cVar43 - (0xff < sVar70)) + '\x01'
    ;
    acStack_220[lVar30 + -4] = ((0 < sVar10) * (sVar10 < 0x100) * cVar42 - (0xff < sVar10)) + '\x01'
    ;
    acStack_220[lVar30 + -3] = ((0 < sVar11) * (sVar11 < 0x100) * cVar41 - (0xff < sVar11)) + '\x01'
    ;
    acStack_220[lVar30 + -2] = ((0 < sVar12) * (sVar12 < 0x100) * cVar40 - (0xff < sVar12)) + '\x01'
    ;
    acStack_220[lVar30 + -1] = ((0 < sVar13) * (sVar13 < 0x100) * cVar39 - (0xff < sVar13)) + '\x01'
    ;
    acStack_220[lVar30] = ((0 < sVar71) * (sVar71 < 0x100) * cVar44 - (0xff < sVar71)) + '\x01';
    acStack_220[lVar30 + 1] = ((0 < sVar14) * (sVar14 < 0x100) * cVar46 - (0xff < sVar14)) + '\x01';
    acStack_220[lVar30 + 2] = ((0 < sVar15) * (sVar15 < 0x100) * cVar47 - (0xff < sVar15)) + '\x01';
    acStack_220[lVar30 + 3] = ((0 < sVar16) * (sVar16 < 0x100) * cVar48 - (0xff < sVar16)) + '\x01';
    acStack_220[lVar30 + 4] = ((0 < sVar17) * (sVar17 < 0x100) * cVar49 - (0xff < sVar17)) + '\x01';
    acStack_220[lVar30 + 5] = ((0 < sVar18) * (sVar18 < 0x100) * cVar50 - (0xff < sVar18)) + '\x01';
    acStack_220[lVar30 + 6] = ((0 < sVar19) * (sVar19 < 0x100) * cVar51 - (0xff < sVar19)) + '\x01';
    acStack_220[lVar30 + 7] = ((0 < sVar20) * (sVar20 < 0x100) * cVar52 - (0xff < sVar20)) + '\x01';
    lVar36 = auVar60._8_8_;
    auVar60._0_8_ = auVar60._0_8_ + 0x10;
    auVar60._8_8_ = lVar36 + 0x10;
    lVar36 = auVar59._8_8_;
    auVar59._0_8_ = auVar59._0_8_ + 0x10;
    auVar59._8_8_ = lVar36 + 0x10;
    lVar36 = auVar58._8_8_;
    auVar58._0_8_ = auVar58._0_8_ + 0x10;
    auVar58._8_8_ = lVar36 + 0x10;
    lVar36 = auVar57._8_8_;
    auVar57._0_8_ = auVar57._0_8_ + 0x10;
    auVar57._8_8_ = lVar36 + 0x10;
    lVar36 = auVar56._8_8_;
    auVar56._0_8_ = auVar56._0_8_ + 0x10;
    auVar56._8_8_ = lVar36 + 0x10;
    lVar36 = auVar55._8_8_;
    auVar55._0_8_ = auVar55._0_8_ + 0x10;
    auVar55._8_8_ = lVar36 + 0x10;
    lVar36 = auVar54._8_8_;
    auVar54._0_8_ = auVar54._0_8_ + 0x10;
    auVar54._8_8_ = lVar36 + 0x10;
    lVar36 = auVar38._8_8_;
    auVar38._0_8_ = auVar38._0_8_ + 0x10;
    auVar38._8_8_ = lVar36 + 0x10;
    lVar30 = lVar30 + 0x10;
  } while (lVar30 != 0x28);
  cVar37 = '\0';
  cVar39 = '\x01';
  cVar40 = '\x02';
  cVar41 = '\x03';
  cVar42 = '\x04';
  cVar43 = '\x05';
  cVar44 = '\x06';
  cVar45 = '\a';
  cVar46 = '\b';
  cVar47 = '\t';
  cVar48 = '\n';
  cVar49 = '\v';
  cVar50 = '\f';
  cVar51 = '\r';
  cVar52 = '\x0e';
  cVar53 = '\x0f';
  lVar30 = 0x28;
  do {
    acStack_220[lVar30 + -8] = cVar37 + DAT_001050c0;
    acStack_220[lVar30 + -7] = cVar39 + DAT_001050c0._1_1_;
    acStack_220[lVar30 + -6] = cVar40 + DAT_001050c0._2_1_;
    acStack_220[lVar30 + -5] = cVar41 + DAT_001050c0._3_1_;
    acStack_220[lVar30 + -4] = cVar42 + DAT_001050c0._4_1_;
    acStack_220[lVar30 + -3] = cVar43 + DAT_001050c0._5_1_;
    acStack_220[lVar30 + -2] = cVar44 + DAT_001050c0._6_1_;
    acStack_220[lVar30 + -1] = cVar45 + DAT_001050c0._7_1_;
    acStack_220[lVar30] = cVar46 + DAT_001050c0._8_1_;
    acStack_220[lVar30 + 1] = cVar47 + DAT_001050c0._9_1_;
    acStack_220[lVar30 + 2] = cVar48 + DAT_001050c0._10_1_;
    acStack_220[lVar30 + 3] = cVar49 + DAT_001050c0._11_1_;
    acStack_220[lVar30 + 4] = cVar50 + DAT_001050c0._12_1_;
    acStack_220[lVar30 + 5] = cVar51 + DAT_001050c0._13_1_;
    acStack_220[lVar30 + 6] = cVar52 + DAT_001050c0._14_1_;
    acStack_220[lVar30 + 7] = cVar53 + DAT_001050c0._15_1_;
    cVar37 = cVar37 + DAT_001050d0;
    cVar39 = cVar39 + DAT_001050d0._1_1_;
    cVar40 = cVar40 + DAT_001050d0._2_1_;
    cVar41 = cVar41 + DAT_001050d0._3_1_;
    cVar42 = cVar42 + DAT_001050d0._4_1_;
    cVar43 = cVar43 + DAT_001050d0._5_1_;
    cVar44 = cVar44 + DAT_001050d0._6_1_;
    cVar45 = cVar45 + DAT_001050d0._7_1_;
    cVar46 = cVar46 + DAT_001050d0._8_1_;
    cVar47 = cVar47 + DAT_001050d0._9_1_;
    cVar48 = cVar48 + DAT_001050d0._10_1_;
    cVar49 = cVar49 + DAT_001050d0._11_1_;
    cVar50 = cVar50 + DAT_001050d0._12_1_;
    cVar51 = cVar51 + DAT_001050d0._13_1_;
    cVar52 = cVar52 + DAT_001050d0._14_1_;
    cVar53 = cVar53 + DAT_001050d0._15_1_;
    lVar30 = lVar30 + 0x10;
  } while (lVar30 != 0x48);
  uStack_198 = 0x48;
  uVar32 = 0;
  iVar22 = secp256k1_ecdsa_sign(uStack_228,auStack_f8,acStack_220,auStack_200,0);
  if (iVar22 == 0) {
LAB_00103a6c:
    main_cold_10();
LAB_00103a71:
    main_cold_9();
  }
  else {
    iVar22 = secp256k1_ecdsa_signature_serialize_der(uStack_228,auStack_1e0,&uStack_198,auStack_f8);
    if (iVar22 == 0) goto LAB_00103a71;
    iVar22 = secp256k1_ec_pubkey_create(uStack_228,auStack_b8,auStack_200);
    if (iVar22 != 0) {
      uStack_168 = 0x21;
      iVar22 = secp256k1_ec_pubkey_serialize(uStack_228,auStack_190,&uStack_168,auStack_b8,0x102);
      if (iVar22 != 1) goto LAB_00103a7b;
      printf("%-30s,%-15s,%-15s,%-15s\n","Benchmark","    Min(us)    ","    Avg(us)    ",
             "    Max(us)    ");
      putchar(10);
      iVar22 = (int)uVar33;
      if (argc == 1) {
LAB_001034c3:
        run_benchmark("ecdsa_verify",bench_verify,(_func_void_void_ptr *)0x0,
                      (_func_void_void_ptr_int *)&uStack_228,(void *)(uVar33 & 0xffffffff),
                      (int)uVar32,in_stack_fffffffffffffd50);
      }
      else {
        lVar30 = 8;
        do {
          lVar36 = lVar30;
          if (lVar31 - lVar36 == 0) goto LAB_00103469;
          iVar23 = strcmp(*(char **)((long)argv + lVar36),"ecdsa");
          lVar30 = lVar36 + 8;
        } while (iVar23 != 0);
        if (lVar31 - lVar36 != 0) goto LAB_001034c3;
LAB_00103469:
        lVar30 = 8;
        do {
          lVar36 = lVar30;
          if (lVar31 - lVar36 == 0) goto LAB_00103496;
          iVar23 = strcmp(*(char **)((long)argv + lVar36),"verify");
          lVar30 = lVar36 + 8;
        } while (iVar23 != 0);
        if (lVar31 - lVar36 != 0) goto LAB_001034c3;
LAB_00103496:
        lVar30 = 8;
        do {
          lVar36 = lVar30;
          if (lVar31 - lVar36 == 0) goto LAB_001034e3;
          iVar23 = strcmp(*(char **)((long)argv + lVar36),"ecdsa_verify");
          lVar30 = lVar36 + 8;
        } while (iVar23 != 0);
        if (lVar31 - lVar36 != 0) goto LAB_001034c3;
      }
LAB_001034e3:
      if (argc == 1) {
LAB_00103573:
        run_benchmark("ecdsa_sign",bench_sign_run,bench_sign_setup,
                      (_func_void_void_ptr_int *)&uStack_228,(void *)(uVar33 & 0xffffffff),
                      (int)uVar32,in_stack_fffffffffffffd50);
      }
      else {
        lVar30 = 8;
        do {
          lVar36 = lVar30;
          if (lVar31 - lVar36 == 0) goto LAB_00103519;
          iVar23 = strcmp(*(char **)((long)argv + lVar36),"ecdsa");
          lVar30 = lVar36 + 8;
        } while (iVar23 != 0);
        if (lVar31 - lVar36 != 0) goto LAB_00103573;
LAB_00103519:
        lVar30 = 8;
        do {
          lVar36 = lVar30;
          if (lVar31 - lVar36 == 0) goto LAB_00103546;
          iVar23 = strcmp(*(char **)((long)argv + lVar36),"sign");
          lVar30 = lVar36 + 8;
        } while (iVar23 != 0);
        if (lVar31 - lVar36 != 0) goto LAB_00103573;
LAB_00103546:
        lVar30 = 8;
        do {
          lVar36 = lVar30;
          if (lVar31 - lVar36 == 0) goto LAB_00103598;
          iVar23 = strcmp(*(char **)((long)argv + lVar36),"ecdsa_sign");
          lVar30 = lVar36 + 8;
        } while (iVar23 != 0);
        if (lVar31 - lVar36 != 0) goto LAB_00103573;
      }
LAB_00103598:
      if (argc == 1) {
LAB_00103628:
        run_benchmark("ec_keygen",bench_keygen_run,bench_keygen_setup,
                      (_func_void_void_ptr_int *)&uStack_228,(void *)(uVar33 & 0xffffffff),
                      (int)uVar32,in_stack_fffffffffffffd50);
      }
      else {
        lVar30 = 8;
        do {
          lVar36 = lVar30;
          if (lVar31 - lVar36 == 0) goto LAB_001035ce;
          iVar23 = strcmp(*(char **)((long)argv + lVar36),"ec");
          lVar30 = lVar36 + 8;
        } while (iVar23 != 0);
        if (lVar31 - lVar36 != 0) goto LAB_00103628;
LAB_001035ce:
        lVar30 = 8;
        do {
          lVar36 = lVar30;
          if (lVar31 - lVar36 == 0) goto LAB_001035fb;
          iVar23 = strcmp(*(char **)((long)argv + lVar36),"keygen");
          lVar30 = lVar36 + 8;
        } while (iVar23 != 0);
        if (lVar31 - lVar36 != 0) goto LAB_00103628;
LAB_001035fb:
        lVar30 = 8;
        do {
          lVar36 = lVar30;
          if (lVar31 - lVar36 == 0) goto LAB_0010364d;
          iVar23 = strcmp(*(char **)((long)argv + lVar36),"ec_keygen");
          lVar30 = lVar36 + 8;
        } while (iVar23 != 0);
        if (lVar31 - lVar36 != 0) goto LAB_00103628;
      }
LAB_0010364d:
      secp256k1_context_destroy(uStack_228);
      auStack_160[0] = secp256k1_context_create(1);
      if (argc != 1) {
        lVar30 = 8;
        do {
          if (lVar31 - lVar30 == 0) goto LAB_001036bc;
          iVar23 = strcmp(*(char **)((long)argv + lVar30),"ecdh");
          lVar30 = lVar30 + 8;
        } while (iVar23 != 0);
      }
      run_benchmark("ecdh",bench_ecdh,bench_ecdh_setup,(_func_void_void_ptr_int *)auStack_160,
                    (void *)(uVar33 & 0xffffffff),(int)uVar32,in_stack_fffffffffffffd50);
LAB_001036bc:
      lStack_258 = lVar31;
      secp256k1_context_destroy(auStack_160[0]);
      auStack_288[0] = secp256k1_context_create(1);
      __size = (long)iVar22 << 3;
      pvStack_278 = malloc(__size);
      pvStack_270 = malloc(__size);
      pvStack_260 = malloc(__size);
      pvStack_268 = malloc(__size);
      if (0 < iVar22) {
        uVar35 = 0;
        do {
          puVar26 = (undefined1 *)malloc(0x20);
          pvVar27 = malloc(0x40);
          pvVar28 = malloc(0x60);
          pvVar29 = malloc(0x20);
          uStack_250 = (undefined1)uVar35;
          *puVar26 = uStack_250;
          uStack_24f = (undefined1)(uVar35 >> 8);
          puVar26[1] = uStack_24f;
          uStack_24e = (undefined1)(uVar35 >> 0x10);
          puVar26[2] = uStack_24e;
          uStack_24d = (undefined1)(uVar35 >> 0x18);
          puVar26[3] = uStack_24d;
          *(undefined8 *)(puVar26 + 4) = 0x6d6d6d6d6d6d6d6d;
          *(undefined8 *)(puVar26 + 0xc) = 0x6d6d6d6d6d6d6d6d;
          *(undefined8 *)(puVar26 + 0x10) = 0x6d6d6d6d6d6d6d6d;
          *(undefined8 *)(puVar26 + 0x18) = 0x6d6d6d6d6d6d6d6d;
          uStack_23c = 0x73737373;
          uStack_238 = 0x7373737373737373;
          uStack_24c = 0x7373737373737373;
          uStack_244 = 0x73737373;
          uStack_240 = 0x73737373;
          *(void **)((long)pvStack_278 + uVar35 * 8) = pvVar28;
          *(void **)((long)pvStack_270 + uVar35 * 8) = pvVar29;
          *(undefined1 **)((long)pvStack_260 + uVar35 * 8) = puVar26;
          *(void **)((long)pvStack_268 + uVar35 * 8) = pvVar27;
          iVar23 = secp256k1_keypair_create(auStack_288[0],pvVar28,&uStack_250);
          if (iVar23 == 0) {
            main_cold_7();
LAB_00103a5d:
            main_cold_6();
LAB_00103a62:
            main_cold_5();
LAB_00103a67:
            main_cold_4();
            goto LAB_00103a6c;
          }
          uVar32 = 0;
          iVar23 = secp256k1_schnorrsig_sign_custom(auStack_288[0],pvVar27,puVar26,0x20,pvVar28);
          if (iVar23 == 0) goto LAB_00103a5d;
          iVar23 = secp256k1_keypair_xonly_pub(auStack_288[0],auStack_160,0,pvVar28);
          if (iVar23 == 0) goto LAB_00103a62;
          iVar23 = secp256k1_xonly_pubkey_serialize(auStack_288[0],pvVar29,auStack_160);
          if (iVar23 != 1) goto LAB_00103a67;
          uVar35 = uVar35 + 1;
        } while ((uVar33 & 0xffffffff) != uVar35);
      }
      lVar31 = lStack_258;
      if (argc != 1) {
        lVar30 = 8;
        do {
          if (lVar31 == lVar30) {
            lVar30 = 8;
            goto LAB_001038b0;
          }
          iVar23 = strcmp(*(char **)((long)argv + lVar30),"schnorrsig");
          lVar30 = lVar30 + 8;
        } while (iVar23 != 0);
      }
      goto LAB_001038f1;
    }
  }
  main_cold_8();
LAB_00103a7b:
  main_cold_3();
  puts("Benchmarks the following algorithms:");
  puts("    - ECDSA signing/verification");
  puts("    - ECDH key exchange (optional module)");
  puts("    - Schnorr signatures (optional module)");
  puts("    - ElligatorSwift (optional module)");
  putchar(10);
  printf("The default number of iterations for each benchmark is %d. This can be\n",20000);
  puts("customized using the SECP256K1_BENCH_ITERS environment variable.");
  putchar(10);
  puts("Usage: ./bench [args]");
  puts("By default, all benchmarks will be run.");
  puts("args:");
  puts("    help              : display this help and exit");
  puts("    ecdsa             : all ECDSA algorithms--sign, verify, recovery (if enabled)");
  puts("    ecdsa_sign        : ECDSA siging algorithm");
  puts("    ecdsa_verify      : ECDSA verification algorithm");
  puts("    ec                : all EC public key algorithms (keygen)");
  puts("    ec_keygen         : EC public key generation");
  puts("    ecdh              : ECDH key exchange algorithm");
  puts("    schnorrsig        : all Schnorr signature algorithms (sign, verify)");
  puts("    schnorrsig_sign   : Schnorr sigining algorithm");
  puts("    schnorrsig_verify : Schnorr verification algorithm");
  puts("    ellswift          : all ElligatorSwift benchmarks (encode, decode, keygen, ecdh)");
  puts("    ellswift_encode   : ElligatorSwift encoding");
  puts("    ellswift_decode   : ElligatorSwift decoding");
  puts("    ellswift_keygen   : ElligatorSwift key generation");
  puts("    ellswift_ecdh     : ECDH on ElligatorSwift keys");
  putchar(10);
  return;
  while( true ) {
    iVar23 = strcmp(*(char **)((long)argv + lVar30),"sign");
    lVar30 = lVar30 + 8;
    if (iVar23 == 0) break;
LAB_001038b0:
    if (lVar31 == lVar30) {
      lVar30 = 8;
      goto LAB_001038d8;
    }
  }
  goto LAB_001038f1;
  while( true ) {
    iVar24 = strcmp(*(char **)((long)argv + lVar30),"verify");
    iVar23 = (int)uVar32;
    lVar30 = lVar30 + 8;
    if (iVar24 == 0) break;
LAB_00103948:
    if (lVar31 == lVar30) {
      lVar30 = 8;
      goto LAB_00103970;
    }
  }
  goto LAB_00103989;
  while( true ) {
    iVar24 = strcmp(*(char **)((long)argv + lVar30),"schnorrsig_verify");
    iVar23 = (int)uVar32;
    lVar30 = lVar30 + 8;
    if (iVar24 == 0) break;
LAB_00103970:
    if (lVar31 == lVar30) goto LAB_001039a6;
  }
  goto LAB_00103989;
  while( true ) {
    iVar23 = strcmp(*(char **)((long)argv + lVar30),"schnorrsig_sign");
    lVar30 = lVar30 + 8;
    if (iVar23 == 0) break;
LAB_001038d8:
    if (lVar31 == lVar30) goto LAB_0010390e;
  }
LAB_001038f1:
  run_benchmark("schnorrsig_sign",bench_schnorrsig_sign,(_func_void_void_ptr *)0x0,
                (_func_void_void_ptr_int *)auStack_288,(void *)(uVar33 & 0xffffffff),(int)uVar32,
                in_stack_fffffffffffffd50);
LAB_0010390e:
  iVar23 = (int)uVar32;
  if (argc != 1) {
    lVar30 = 8;
    do {
      if (lVar31 == lVar30) {
        lVar30 = 8;
        goto LAB_00103948;
      }
      iVar24 = strcmp(*(char **)((long)argv + lVar30),"schnorrsig");
      iVar23 = (int)uVar32;
      lVar30 = lVar30 + 8;
    } while (iVar24 != 0);
  }
LAB_00103989:
  run_benchmark("schnorrsig_verify",bench_schnorrsig_verify,(_func_void_void_ptr *)0x0,
                (_func_void_void_ptr_int *)auStack_288,(void *)(uVar33 & 0xffffffff),iVar23,
                in_stack_fffffffffffffd50);
LAB_001039a6:
  if (0 < iVar22) {
    uVar35 = 0;
    do {
      free(*(void **)((long)pvStack_278 + uVar35 * 8));
      free(*(void **)((long)pvStack_270 + uVar35 * 8));
      free(*(void **)((long)pvStack_260 + uVar35 * 8));
      free(*(void **)((long)pvStack_268 + uVar35 * 8));
      uVar35 = uVar35 + 1;
    } while ((uVar33 & 0xffffffff) != uVar35);
  }
  free(pvStack_278);
  free(pvStack_270);
  free(pvStack_260);
  free(pvStack_268);
  secp256k1_context_destroy(auStack_288[0]);
  run_ellswift_bench(iVar22,argc,argv);
  return;
}

Assistant:

static void bench_ellswift_xdh(void *arg, int iters) {
    int i;
    bench_ellswift_data *data = (bench_ellswift_data*)arg;

    for (i = 0; i < iters; i++) {
        int party = i & 1;
        CHECK(secp256k1_ellswift_xdh(data->ctx,
                                     data->rnd64 + (i % 33),
                                     data->rnd64,
                                     data->rnd64,
                                     data->rnd64 + ((i + 16) % 33),
                                     party,
                                     secp256k1_ellswift_xdh_hash_function_bip324,
                                     NULL) == 1);
    }
}